

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_VerifyInputSignature_TEST_PKH_Test::TestBody
          (ConfidentialTransactionController_VerifyInputSignature_TEST_PKH_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  Privkey *this_00;
  SigHashType *pSVar6;
  AssertionResult gtest_ar__1;
  Privkey dummy;
  AssertionResult gtest_ar_;
  ByteData signature;
  ByteData sighash;
  SigHashType sighash_type;
  Pubkey pubkey;
  uint32_t vout;
  Txid txid;
  Privkey privkey;
  ConfidentialTransactionController ctxc;
  ConfidentialValue *in_stack_fffffffffffffc18;
  ConfidentialValue *pCVar7;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffc24;
  string *in_stack_fffffffffffffc28;
  undefined6 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  undefined4 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3c;
  byte in_stack_fffffffffffffc3d;
  undefined2 in_stack_fffffffffffffc44;
  undefined1 in_stack_fffffffffffffc46;
  string local_3a0;
  AssertHelper local_380;
  Message local_378;
  ConfidentialValue local_370;
  SigHashType local_344;
  SigHashType *in_stack_fffffffffffffcc8;
  uint32_t in_stack_fffffffffffffcd4;
  Txid *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  ByteData *in_stack_fffffffffffffce8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcf0;
  SigHashType *in_stack_fffffffffffffcf8;
  ConfidentialValue *in_stack_fffffffffffffd00;
  WitnessVersion in_stack_fffffffffffffd08;
  uint32_t in_stack_fffffffffffffd0c;
  Txid *in_stack_fffffffffffffd10;
  ConfidentialTransactionController *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd30;
  WitnessVersion in_stack_fffffffffffffd38;
  Privkey local_2a8;
  string local_288;
  AssertHelper local_268;
  Message local_260;
  ConfidentialValue local_258;
  SigHashType local_230;
  undefined1 local_221;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  ByteData256 local_1e8;
  ByteData local_1d0;
  ByteData local_1b8;
  AssertHelper local_1a0;
  Message local_198 [2];
  ConfidentialValue local_188;
  SigHashType local_15c [3];
  ByteData local_138;
  SigHashType local_11c;
  Pubkey local_110;
  undefined4 local_f8;
  allocator local_f1;
  string local_f0;
  Txid local_d0;
  Privkey local_b0;
  allocator local_79;
  string local_78 [120];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "02000000010117c10bbfcd4e89f6c33864ed627aa113f249343f4b2bbe6e86dcc725e0d06cfc010000006a473044022038527c96efaaa29b862c8fe8aa4e96602b03035505ebe1f166dd8b9f3731b7b502207e75d937ca1bb2e2f4208618051eb8aad02ad88a71477d7a6e7ec257f72cb6500121036b70f6598ee5c00ad068c9b86c7a1d5c433767a46db3bc3f9d53417171db1782fdffffff030bc7b2b8da0c30f37b12580e0bd092bfbe16e28494fe30feab1769ab4135d30a7609c8e4c3012d90840dbed48eeebc253399645119c01125488640f415285e6e7663031651fe4267cf54e606a83e4c741a01df124d4eb915ae37ad9d5191661d74310b1976a91479975e7d3775b748cbcd5500804518280a2ebbae88ac0b8f78a97d70ad5799c1ef2ca5f7f553ec30fdc87392eb2b5a9acc42d72f5900250978d7a93a301c65b0759c8e7f4b4424ff2a4c124ee2467b08e266423faa3afef30249a8537d641e728c2192f66433e125041341b36fa3e3cde5578ad1acb9a3944b17a9141cd92b989652fbc4c2a92eb1d56456d0ef17d4158701bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000000000971800000a0000000000000043010001cd72e3aa85cc53ce42edd91e03a6b4d3cd6b08d2125f019639f0ae6ee29e7f8539232c60e68020ab948d95e5c70da679309e8a511a1a0ef65c7b5e5f4dfb83c7fd4d0b60230000000000000001c39d00a796090bd9872e87a9d5f06b5c73c4fe64104a59c25536f90813b311c90de520f63a57875a2e9b6111f41f5fb7b4a253c76027af35fbcf7ddb9e5688ebefb04948f349e48e2ef4cd73b17f1d5786822222f2a1e5367bd1d39b139283800bfc4b7d50ce927469541151be53b3518b0fa1e9acb8089072976b1d659e8136c666f0b57cec51775ccd40998ee57ace137e25ee7e066d9d434c0e54304913019db87855de47f7f1e974578dfedb95a92048fafe0dca541bd917ea22d9c02fd58fafc8ee35f016b4b1ebf0051a314038201163b3fc6fa09b7ac0bf45474b216f8e152433433193b6e5db6da465ddd5c0e7d23b6a2e153998e0e936539aa3ce4f1ed448157dff1f420c404c019ec5e86ab18a9b859cc3165a7f104f3a7a9abb6835a62834750f110730e7d16de16cbb7f6607fc4ae04de5baec980e3137766c23568f8bb03473d3e043d3a8d8da0a2613bf27d0ce388ed44b8e1a217b2ef5193d19fb6b943c1b8a1bebfb02b9cea87fec0edbe03ee63a3a1168c53456af1fed9fe7707b2fb58159922cb84e1e28a29d26e036c12c91666096d556eefada060c530a28837f37a456847a26fcee92092837c14144ac3e1f3a84763e40cced0d77dcfe76f537825e08d2441d612d5e80eef617ffa6b96e30825d8905bef96dd4da8457f8d43e3f3c029444..." /* TRUNCATED STRING LITERAL */
             ,&local_79);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            ((ConfidentialTransactionController *)
             CONCAT17(in_stack_fffffffffffffc37,
                      CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cfd::core::Privkey::GenerageRandomKey();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"fc6cd0e025c7dc866ebe2b4b3f3449f213a17a62ed6438c3f6894ecdbf0bc117",
             &local_f1);
  cfd::core::Txid::Txid(&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_f8 = 1;
  cfd::core::Privkey::GeneratePubkey(&local_110,&local_b0,true);
  cfd::core::SigHashType::SigHashType(&local_11c,kSigHashAll,false,false);
  cfd::core::ByteData::ByteData(&local_138);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SigHashType(local_15c,&local_11c);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_188);
      in_stack_fffffffffffffc18 = &local_188;
      in_stack_fffffffffffffc20 = 0xffffffff;
      cfd::ConfidentialTransactionController::CreateSignatureHash
                (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
                 (Pubkey *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                 (ConfidentialValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd38);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (ByteData *)in_stack_fffffffffffffc18);
      cfd::core::ByteData::~ByteData((ByteData *)0x20fce3);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x20fcf0);
    }
  }
  else {
    testing::Message::Message(local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x109,
               "Expected: sighash = ctxc.CreateSignatureHash(txid, vout, pubkey, sighash_type) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a0,local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x20feb3);
  }
  cfd::core::ByteData::ByteData(&local_1b8);
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_fffffffffffffc46 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffc46) {
      cfd::core::ByteData::GetBytes(&local_200,&local_138);
      cfd::core::ByteData256::ByteData256(&local_1e8,&local_200);
      cfd::core::SignatureUtil::CalculateEcSignature(&local_1d0,&local_1e8,&local_b0,true);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (ByteData *)in_stack_fffffffffffffc18);
      cfd::core::ByteData::~ByteData((ByteData *)0x20ffb1);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x20ffbe);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffc37,
                          CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
    }
  }
  else {
    testing::Message::Message(&local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x10d,
               "Expected: signature = SignatureUtil::CalculateEcSignature( ByteData256(sighash.GetBytes()), privkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x2100d4);
  }
  uVar9 = local_f8;
  cfd::core::SigHashType::SigHashType(&local_230,&local_11c);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_258);
  pCVar7 = &local_258;
  uVar8 = 0xffffffff;
  pSVar6 = &local_230;
  uVar3 = cfd::ConfidentialTransactionController::VerifyInputSignature
                    ((ConfidentialTransactionController *)in_stack_fffffffffffffcf0.ptr_,
                     in_stack_fffffffffffffce8,
                     (Pubkey *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  local_221 = uVar3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffc24,uVar8),(bool *)pCVar7,
             (type *)0x2101c3);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x2101d2);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!(bool)uVar4) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_288,(internal *)&local_220,
               (AssertionResult *)
               "ctxc.VerifyInputSignature(signature, pubkey, txid, vout, sighash_type)","false",
               "true",(char *)pSVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x110,pcVar5);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    testing::Message::~Message((Message *)0x2102dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x210357);
  cfd::core::Privkey::Privkey(&local_2a8);
  do {
    cfd::core::Privkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffd38,&local_b0);
    cfd::core::Privkey::GenerageRandomKey();
    this_00 = cfd::core::Privkey::operator=
                        ((Privkey *)CONCAT44(in_stack_fffffffffffffc24,uVar8),(Privkey *)pCVar7);
    cfd::core::Privkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffd18,this_00);
    in_stack_fffffffffffffc3d =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffc46,
                                                 CONCAT24(in_stack_fffffffffffffc44,uVar9))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffc3d,
                                                                CONCAT14(in_stack_fffffffffffffc3c,
                                                                         in_stack_fffffffffffffc38))
                                                )));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
    cfd::core::Privkey::~Privkey((Privkey *)0x2103e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd38);
  } while ((in_stack_fffffffffffffc3d & 1) != 0);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)&stack0xfffffffffffffcc8,&local_2a8,true);
  cfd::core::SigHashType::SigHashType(&local_344,&local_11c);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_370);
  pCVar7 = &local_370;
  uVar9 = 0xffffffff;
  pSVar6 = &local_344;
  cfd::ConfidentialTransactionController::VerifyInputSignature
            ((ConfidentialTransactionController *)in_stack_fffffffffffffcf0.ptr_,
             in_stack_fffffffffffffce8,
             (Pubkey *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffc24,uVar9),(bool *)pCVar7,
             (type *)0x210534);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x210540);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x21054d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffce8);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a0,(internal *)&stack0xfffffffffffffce8,
               (AssertionResult *)
               "ctxc.VerifyInputSignature(signature, dummy.GeneratePubkey(), txid, vout, sighash_type)"
               ,"true","false",(char *)pSVar6);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x117,pcVar5);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    testing::Message::~Message((Message *)0x21065c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2106cb);
  cfd::core::Privkey::~Privkey((Privkey *)0x2106d8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2106e5);
  cfd::core::ByteData::~ByteData((ByteData *)0x2106f2);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2106ff);
  cfd::core::Txid::~Txid((Txid *)0x21070c);
  cfd::core::Privkey::~Privkey((Privkey *)0x210719);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)CONCAT44(in_stack_fffffffffffffc24,uVar9));
  return;
}

Assistant:

TEST(ConfidentialTransactionController, VerifyInputSignature_TEST_PKH)
{
  // input only transaction
  ConfidentialTransactionController ctxc("02000000010117c10bbfcd4e89f6c33864ed627aa113f249343f4b2bbe6e86dcc725e0d06cfc010000006a473044022038527c96efaaa29b862c8fe8aa4e96602b03035505ebe1f166dd8b9f3731b7b502207e75d937ca1bb2e2f4208618051eb8aad02ad88a71477d7a6e7ec257f72cb6500121036b70f6598ee5c00ad068c9b86c7a1d5c433767a46db3bc3f9d53417171db1782fdffffff030bc7b2b8da0c30f37b12580e0bd092bfbe16e28494fe30feab1769ab4135d30a7609c8e4c3012d90840dbed48eeebc253399645119c01125488640f415285e6e7663031651fe4267cf54e606a83e4c741a01df124d4eb915ae37ad9d5191661d74310b1976a91479975e7d3775b748cbcd5500804518280a2ebbae88ac0b8f78a97d70ad5799c1ef2ca5f7f553ec30fdc87392eb2b5a9acc42d72f5900250978d7a93a301c65b0759c8e7f4b4424ff2a4c124ee2467b08e266423faa3afef30249a8537d641e728c2192f66433e125041341b36fa3e3cde5578ad1acb9a3944b17a9141cd92b989652fbc4c2a92eb1d56456d0ef17d4158701bdc7073c43d37ace6b66b02268ece4754fe6c39a985a16ccbe6cf05b89014d7201000000000000971800000a0000000000000043010001cd72e3aa85cc53ce42edd91e03a6b4d3cd6b08d2125f019639f0ae6ee29e7f8539232c60e68020ab948d95e5c70da679309e8a511a1a0ef65c7b5e5f4dfb83c7fd4d0b60230000000000000001c39d00a796090bd9872e87a9d5f06b5c73c4fe64104a59c25536f90813b311c90de520f63a57875a2e9b6111f41f5fb7b4a253c76027af35fbcf7ddb9e5688ebefb04948f349e48e2ef4cd73b17f1d5786822222f2a1e5367bd1d39b139283800bfc4b7d50ce927469541151be53b3518b0fa1e9acb8089072976b1d659e8136c666f0b57cec51775ccd40998ee57ace137e25ee7e066d9d434c0e54304913019db87855de47f7f1e974578dfedb95a92048fafe0dca541bd917ea22d9c02fd58fafc8ee35f016b4b1ebf0051a314038201163b3fc6fa09b7ac0bf45474b216f8e152433433193b6e5db6da465ddd5c0e7d23b6a2e153998e0e936539aa3ce4f1ed448157dff1f420c404c019ec5e86ab18a9b859cc3165a7f104f3a7a9abb6835a62834750f110730e7d16de16cbb7f6607fc4ae04de5baec980e3137766c23568f8bb03473d3e043d3a8d8da0a2613bf27d0ce388ed44b8e1a217b2ef5193d19fb6b943c1b8a1bebfb02b9cea87fec0edbe03ee63a3a1168c53456af1fed9fe7707b2fb58159922cb84e1e28a29d26e036c12c91666096d556eefada060c530a28837f37a456847a26fcee92092837c14144ac3e1f3a84763e40cced0d77dcfe76f537825e08d2441d612d5e80eef617ffa6b96e30825d8905bef96dd4da8457f8d43e3f3c0294443c0b5a5a2a1b2f32f6402873c7de17276ec66b0fddf246fcb305e88a09c45e1c1322d5e152216d09a02654e83b503454dfeacd52129b4956ad300a9d52ca9f955f1babb56a1a676f243ce7ef69cacbfb23cb71907a6b8ff1a42c4769c5298d5fd5027e1c352a582231a5323b02da24ba5c2df5e125554ed0ee1cb5e9e65eda5c683469d264c9f0adbfc5fcbb3459da30ef31dd7cb32a9d5d6d2b412db81df3345f09065151b0190ec07ff0c5573d4c783be1f8aeb27d8042387352d62e808b24b834fef27d1c986da5207e5c9645026bff40577fc167b321fa17b31872bc0f796dc834f66f9302a4ce505f3f1e865a0ba9be615efe25dbdb2c3b61bc03206e6891469ce11c4065a2fcf03cb436d9182d66ce452038ac5f4fd8dc61e20f4a4f8cb7ad81e9a66c8b12d592c445ffe905495bf1e277de55a10da8c48dfdb0db1c2d2be9077c47326d0611dff08131063680fd858ad72e53d3eafe0a85f436eb3e03100a0f98057ddf1c47372ff318bad1b3cae928aeaf98608e397e4d8aa0c2fa594eaa9386e6fc8642077cc6c2f81a3e59704269a556eeb90161ef0f7271b798a5ac6430e0986d6c6c5b0ddeb2ef22c873a338824ba46bd3b634cd30143d66237eed3d89041e38e178f1dee6a5c0da039804face0a90c6c8b58a5b86b402e964678029a71c8c4c82ffba9fdef3c055493eef3e61b5e3aef9cc73816eb3360d2c719b198428f5a904ee1f241b20712aa67f4737fe56ba3884bc0aaaee8faa2d39ccf125f92c35877bb0ecccf0d95376a30464873475f62faadb18013e3cc879c4e42b166d20042980b84aa9be48ef7578664464956caabcbf3ab2cec3f87b0ae1c7d3ebe2234489491ceb0f4b3445308dc4c41f68ada861c95e9f0b0ed2da0b9bdc882923a4ec7118fe6eb1af554aa018c7df6f6987c353ef63017add74324b46c5a6910f8d929ff3d2ec271207fa7220ddaec2c3746fb8a12d49b2b0e8896a08f44e49c58ebe7eae582982e7bd5abd9289da25cddeb8e14c56faf1443be3a51516ac8eb463b643b10bec77052b48397bdae8a3948b19a58a98c2ded30b54abad2d930fcbb4ac74e6557b8764bafc566988071e74e1f516b367fcb6cbc23ce4171dbe8bbdfd8347f121e509052bc1870dd22bdfcbfca952ccd751005dd11649a3ee9db35a65d1975166a29a1186381f4055db5940ffc4034c68360f1c3ef6a20a7aece3e084d8c67eb48dddb3ec4c964c11826172edf44bae8676b2cfcf81cdf2f16e642081944a46bd2ddfffcb0b1862d83ef5592e57409c8f7b6d359a2d0cb1d1fd0d2f55428144764f0127ad78d202c0fdbc6ee5139d33fc78183199115dc21a4a7a006559deda04f01a21d32a41950d324f1b728583daaadd4c355c04a9496e485393803099ce10627f214bf872f1dd3848afe1e884e21db791a596cd7e9eb5cb1ed24ddaee49b90baf83425f48067c367b7038db82ba50ecc5363cc9ef954c583e3eaaaa9579e34a8f28acdc51f857154bfa3db2cbff5b0513f5d91de7195922e4f092602b0c4e2efae95f00030cb8f9a9f717917e279d5c4139f54866e765b3db872b7a6085452bb9a548c3613b458bb41aa80b56e6b47bcc1af86ea391ad446a5d1f3552255645ac224653a52e0ac112c84455979a58bac88eccd346ed99a6ab7fccb98daa062e387fe31501be23406cbd48e44f11801b75dfe93efadc49564ce57afd4cfd39cd1616f8e50b16e8e06311c04e4c98ba4fed7496666e6526cfbc5a9d3121fb25e9744914bfad8c3de1a18b942f7f0dccd89d0ed3a3e4d84d2664acf781e365bb3c2b3e9340db66b8b2a5850535898113f0e9e1e215c70c5241e82c005b2e45e1d73f51b6cc8adf2a0f5e6a931005fd6bd5e572937f79f75b0bc09e6e606e3769b23ee96ddeb3058d7f7fc9c9c0dfce5486032be1478fa5452d9ed019025760543179b002e68f1e9483e35d50bbab770b2639ad95f6667a59451de23f45cc7e50f1ec55374426e16a9ab3d6f8d16da2c7ff020e7972a66bb05bd707ac78c51c2238442eb24cad8db44439388e979714d5a5146c5c1609dbdcce2f5d8040f50dd2b83f57577c6e4795b6e753a58075939429cc4afce88e212e0fb09fe462b81c2b53cf0e7f8c483e5bebc3ed9dd29302d527a8994bf1564d80c5f93e724256f5462eceddfb42643c0f9626c16f04f438ce1838037620a5cb25347603955a29c6ca4a9cc9ca7a6f4b0f70c31bce11a30ddb456284df75774f1e7a43fcece176d91681ecaaaf03163d214a0164ce8408346e32548b04c050ad536e030bd5937a889faf49e58a7541c4a851f7d7e3033cb67736922bd501c9e3f9874ccb15d83814b2289e5b189e465b8e2bf2e2c7fd3809acbb3006c6cc52794efe490c81a9aa47e70041fe83d665501755fdb58aec42b0868bacccc64cdc93718357292a1194bae59dd878d0652a8f3617ac27d70bad6a13ed603dd5cbaa3bad81be71080d5d83b17e17268ab2886305dd1255f71513bfec828b09d8fec5747cdbb04fbac230328554f5c5a1447767be43e3478e6656470df605b8f8f6da8e1180d27ba691e81544c70ee865be596a9189474a4ecd5d747c1dce7b13d6d87548f365e261e9614fa0f23092eadc4736c507735cda4de06d0d26cc1b56e5f73ee90fe5b98bdb13da7deaa2b69ef45ebff11fb996f05bf20da22bf8b0ad42c709a66a96826330468621c11aec2037653676fdff88b8608620c6b66fd6dfe32d9a26e78ddc30af791353018d8ac8932c02750c4c65b7521b5b06ac67c6cfb7208c566e936a22c975542f898bd21c323633dd88de7e2cce6fcac321427616fd0251a4021bba684ec211d086d77c260b34f90e7e5fb6e8fc5d13093d206e968f90bc1ba4d81be9ce628240f45d6b2304d4325e584ff26ffce6c750a8ed717023314394d85522536ecad24329a5accbc07f729b420e51ae2376b91332372ca31340978f92efb651519a5c1b1a51bbe36937cbcc03d275f0b47b24268367116e3e10abd1c3309aa7ce34948cf71e28532a5461e677178b8b502a872a9fd2ce9dcc32ade49e6eacc2fd0d45b5eed217d5dc4eaee1285f7b84273722c11b31e6e5883a2cfafe1ddd932416dd370154dad23cf2cbf19fc457127ac0f798dc4c897baab75e5bdd9b716cc75960b63c046be1ac5899491715399e02e764b5843470cbeecb09593c3fcc219174af4ae3676e42474086de66af619367f2f2d8c35debf4c05e30d977b927c859106e93881eabd412cdb1e9fe57a888a887baa68f1430eb8b024a2cff4e1261862564c41c691fb2a6f23698ac59b337049a9fa7f181aa0e3097da72004ad10cf102e94399b59230e8144be80b3c615a3181e8c5d3a04301000180a7ad67c40d615de0cd11824b672a8de6c641f3838ffff23d44b5bacc7c4c388d2a7f424b83ca04c468823634b0efc5f267a281d2e13bc9d30604a6688062aefd4d0b60230000000000000001199a003a0c07eb5fc7ff995a228aacd2ec3719819a9dec0aa26d10adc9c1a58d836093180ca76a3f8f67ac72668e909264852a2d1427ec85a02544219dc00181ec605ec8cbaa7af879501cd3a4e7398d78af3aaba9d5d6ea0504404ea1312b90c3628bea1d458c296594d773e3fa86b0ae1bd70845a8ac82e8c9386ff2da6d2739f74b221bcd68e3412a20d16bcc951869942da413f7a2cedb06c4fbcf3a89e5898314c35e6ddf3dc657f24f4c828f2c73604d14b312b2962e1b50494d294751f861c9343fcc2e3734545f25219cc48a099881d3bde6cfc64f54a21c934388a1c93f0a396b4cfd356a86e36e63dd9ea10196a10cdac69fc7f38a36fcf91521af60918d3083e57ee9413edec7f660af704e966b45a84cc14e0c56831ca27ef5082c291852f60a31305a36238daee77bb447e988319135e4fc2be7fa0db7b145874164f90589bff507f32f8c4ef27b4697283c955e84925552e8d61419ad08b2b40b55fb729b76034610f5606c930b6d4eb5578b27547554200e9185c27ec84169f2db8341783bbbaffc76b80e557974ae40de2acac657b8d1f03e49ed4ddf298083bcfdea14d01f7a31ea731dd2cfaf2a5a229847ac227d7c14ec1a68e2d748b63182515571c4e41dc69b95c6467316b0be33da252a32b27cf35e0d0a9a759cf9c7ee84489ed1254214c586d8ddb6a228e6498dc7379c49b344b160447c7e01cbfcbe92eab3eba4da9664b5db003486ddfca31864d16fe51851bb043f62723d3ef03452a263e4dd11da93ce9f7dc2db5ae16b64a2ce07d81d4a2bd35d62abbe05ec7b2af6327c99a04c0b9316942fa74878bd91b96bc1304e6f2be7e50ccf7bc866ad37fb34effe83700d3ea93e220d5251dfad1af156b84f4fa9d97dcc62f140c26f8369716d9ceaa5ffc69a9ee647fbdc648da9eabbd6e36a271a00840ce75e9addee57074b866429b98547c3c380b9defef2b65742ed5fa4b4acaa59324ed8cc491e51f4c15a34a3b712c91acb9c5cad43be2e481206f5e8be006eb6d632a31df1bc2bce4e267ae48c75c10d7ad7d54b4a3579bdc8c27cee6f7067a63acba681a34eeaeebee359d82ba0bea46baecdc40c641f9995ca3f7daa9c5679ed160fad6b3755466cd463d3e7a117ba3c311ba7aba451b288a02c3b0c462f21dbc0dfd1cd805d40bcf85d78bfa7a1a689edb599f5d54956d3a11d5f3f2b0b0cb72851605cb7e90f9401e9be9f6f1014a43502dec2291f3b583c99ad4192ee5c3bb01024aebed7d3276cf61bf5bbc495174c6bd8a9ab37a166e9b48da9216d7f476199566827a329ec3ed48892a4b19d7c2be4aa7f0bd1843aea86869615df5ad8cb327874ab9d297270140cf519994c425c4d08700360dd3427e7be91521cfd671f844e28d3e1298c1b81be596e2aafc42e727697b30c981eb70a104d8277cdedf55dccd4ceb95657ddf30d9990ba1d2c67b6ae863c7dbb7d1898cf90181f3375bc7c7ca42fbd6a51d30ea19331fd9fd93a0b68d985505296c89e0d2f38871546c9d6805459f9c26e8f503673823d34a03ba63090c499ad21a1629197f772dea62f4989e8ebde6e18cedfcba7ab3956df479d59a2e19d86b1a3c0ed8fc298871b270a720b6853f6609bc33d095ce2d506b7b32c4f63ea30b4b484c29c616ff6a800aaa080f1374c5f72cb6e186e56b6ecd9de8bbdc79a4282182867eaf41e1e789caadb4a01dd9eafadab1035396434112db932e3d4a9a7c2d5ab635e2917c1ee3242bc98e6b36499a588b90abd7224619e9421c53f710f3bad74db88305c1af4d4bb97438d49a8d46257d7adc3290e96bb05029f78f1cc54cabc21da94c768400a0a7ddcb147df8dc2b6353d261b48a47eccca5ffaff80e9fb5ecea1efa940806777c16c0ccebf5d5c9c8d3d64afc1ceb72aad306390ee4e1ce418317d229547cf7d96fa6c3e72624d138438ac3df68b6cdf4bb54812cd31dac2e5ab2d4090ca8a01de888199b205ab31933227646c8b6e8faddf08dd94438cc0fdf5b4c8ef7c48123b8c9d16a09162895c75469447ee4630a5c52f716ceb3fc73653f56fc90753dcde00c7e1b4e46a9a1f40674fd130dea42f935d9e811261057871e4367ec42b9b6127f3687e10e6777b3e4d537695d01a5053c14a70b6435c624cdcc93c4b9fc68726590d64d8ed3ac9b74609851f868e03568ced113968babeef5d4eb95b33d0c0d196d55f58bb394ed9109c89f3f8317cfdbac738aaeed72afcf146dd5e3f2555e77f0d959263961c55989b01dc47172103c1a27050ffd5272ef700aa1cf24ef2e2c1c640251b64567a55ba813389e5b851764ab6966fcd08f2e33ef77eadaf83d7c734dd849e5ff0e9a18b5739d7322600b0d8b459cefb9eb424a481043e0bd67af17fe15de1269f3f96173925ef0dfef6b39fccf35d9a961f682dd9d976e735c6fc7139e7c398e0af4488a0760766e5dca6d1a3d8641d872ee1614d55d9a31929207adc0e813594f2571eac8160f882ee9ccefdeeb3cb98a2b885871ce17a4262b4c0bc53b21491d86866e5bcce058aa978bd84b0a21ff4e03a6547054e8f41b5b24926ee808c50f6f857bf09e070612b9816cd79eb18cc7ce58f84404d031fd7f8d9433880ec5a40090625e6580337ff84b10de7331a9cf93aa81768fccda2efaa8a9617c788540726662194d17be8cbb7e5799a7766294fa11fcfa34955f5ffefeca4356a58b255104b5a84822789dbab7f99393410eb356dd2694b5c5068566c572c11ca4aac9820461560488691bb11ee2dffbe5b87118ed017d3e4a1fe9c4f1c9bd18b70ccac6691ca104b90d376d6763537ba767caef629d3c940b5f96857d7bd3e1927193e4daba0b6c0c99ed89e2a177e3cc80cd37bfb9613ca9a4aea47eb311353aae84e5fd231531428635178a05e7c59251305c8a0c9ea66d8ad73ea7288379e49ce1f6afd59c13163f00720105810681fe57ca8980f0945c4d8d490e2fd70141485ade4b2f1c9434b7d2593490810b5018c06cdf8729c17cbc17f44a2bbe242e4e6a905e53910139375dfe05f48baa0d5f13ea1830c85c5188206ff68c3578b860fd201b8aa8ef87cbbfc2784d2f0db470bcfe9b693cf2286d7c1834746159e7710e00878ba814ace639765b08fc36a0862b80a06445a05b85e71fa5132e8697a73085afc1ea11a91d8373be39ea60b0e7d6a7cd66872eb91a3dd24aeedaac82f9f3c459f0020dc636b42b55f5b379b50bbca6a6fe80aaa7c8cd629cd735675787f82905eb5139e79337ab0da46a0f56ad6abcf7af9cb0b7f5a9675aae6e9bb11918fbb2f5a9c7efefb8b610ba55b748b4e5b5f58b67a188fbee42e3ddd57a34bf696e9720081e4f510c6b4e928984ac75525bf3c7b22c2dd21e4a2a292e1497b69aa7843fd23f00aee321abfd59a821126e2df88e1bda8a4d6d2dfca3702cb24933b0692a3430e5839663da12b4223ec334fa7be72640c1e7554ad58b08962059cd29270021daef264b0269a24b79b18f041fb8ffc78bf491c9f2665fae997f2373bc4616cf269cdadedd061ed983c076130897e4a43b0db1214a83c18e5be77642fad84e66cc0dfcff4cbc22d025c9c23ad1472a32b77f0b7c3fb9bc85e23ec498baf3cafb14b341699ae65e257835e1b8ceffed3f958077e0678d959e03c4cffdf5baef730b5697f042d1e7d869e3b34c318c2928f56a78bbdb5fcf9ec0db2ad0ebab630a0b010114bea72c5017667021a311fab8a7ac1fee3587624b2561e447ef9f0bdac31e2e923fd5b2affb3d2efc9ce16bd2930682caaeea2b3197b142cab7767c1a043fc3e39ddfcdff3f520d89efd43d06bfbd95055df25bb55a0138bd187ba99cdc4c469f1e4d8da05f68117cbe6c0f56be0b3b2605c4185adf48df8b113210e2752070a1c2409eeda7764c4c0bb66b6c3ef6e1e02de7c13f19ff730edd70fdca25d76c77c839d19665156b6c8a3dee400f68abe17a270fee5207ae82137719936ce29e9351f7cedf02b14a6033d228b2edb522104eca5c27a7567bba3b8ca80b3f1aa8cb9e9e5464a7a73bf09606ecc6d2c9390cdb20000");
  Privkey privkey = Privkey::GenerageRandomKey();

  // create sighash
  Txid txid("fc6cd0e025c7dc866ebe2b4b3f3449f213a17a62ed6438c3f6894ecdbf0bc117");
  uint32_t vout = 1;
  Pubkey pubkey = privkey.GeneratePubkey();
  SigHashType sighash_type(SigHashAlgorithm::kSigHashAll);
  ByteData sighash;
  EXPECT_NO_THROW(sighash = ctxc.CreateSignatureHash(txid, vout, pubkey, 
      sighash_type));

  ByteData signature;
  EXPECT_NO_THROW(signature = SignatureUtil::CalculateEcSignature(
      ByteData256(sighash.GetBytes()), privkey));

  EXPECT_TRUE(ctxc.VerifyInputSignature(signature, pubkey, txid, vout,
      sighash_type));

  // check signature another pubkey
  Privkey dummy;
  while(privkey.GetHex() == (dummy = Privkey::GenerageRandomKey()).GetHex()) {
    // do nothing
  }
  EXPECT_FALSE(ctxc.VerifyInputSignature(signature, dummy.GeneratePubkey(), txid, vout, sighash_type));
}